

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O0

uint32_t FAudioSourceVoice_Start(FAudioSourceVoice *voice,uint32_t Flags,uint32_t OperationSet)

{
  code *pcVar1;
  int iVar2;
  uint32_t uVar3;
  int in_EDX;
  int in_ESI;
  long *in_RDI;
  SDL_AssertState sdl_assert_state_1;
  SDL_AssertState sdl_assert_state;
  uint32_t in_stack_ffffffffffffffd8;
  uint32_t in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  if ((in_EDX == 0) || (*(char *)(*in_RDI + 1) == '\0')) {
    do {
      if (*(int *)((long)in_RDI + 0xc) == 0) goto LAB_0012897e;
      iVar2 = SDL_ReportAssertion(&FAudioSourceVoice_Start::sdl_assert_data,
                                  "FAudioSourceVoice_Start",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FAudio.c"
                                  ,0x956);
    } while (iVar2 == 0);
    if (iVar2 == 1) {
      pcVar1 = (code *)swi(3);
      uVar3 = (*pcVar1)();
      return uVar3;
    }
LAB_0012897e:
    do {
      if (in_ESI == 0) goto LAB_001289c8;
      iVar2 = SDL_ReportAssertion(&FAudioSourceVoice_Start::sdl_assert_data_1,
                                  "FAudioSourceVoice_Start",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FAudio.c"
                                  ,0x958);
    } while (iVar2 == 0);
    if (iVar2 == 1) {
      pcVar1 = (code *)swi(3);
      uVar3 = (*pcVar1)();
      return uVar3;
    }
LAB_001289c8:
    *(undefined1 *)(in_RDI + 0x23) = 1;
  }
  else {
    FAudio_OPERATIONSET_QueueStart
              ((FAudioSourceVoice *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
  }
  return 0;
}

Assistant:

uint32_t FAudioSourceVoice_Start(
	FAudioSourceVoice *voice,
	uint32_t Flags,
	uint32_t OperationSet
) {
	LOG_API_ENTER(voice->audio)

	if (OperationSet != FAUDIO_COMMIT_NOW && voice->audio->active)
	{
		FAudio_OPERATIONSET_QueueStart(
			voice,
			Flags,
			OperationSet
		);
		LOG_API_EXIT(voice->audio)
		return 0;
	}


	FAudio_assert(voice->type == FAUDIO_VOICE_SOURCE);

	FAudio_assert(Flags == 0);
	voice->src.active = 1;
	LOG_API_EXIT(voice->audio)
	return 0;
}